

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mutex.h
# Opt level: O0

Locked<const_unsigned_int> __thiscall
kj::MutexGuarded<unsigned_int>::lockShared(MutexGuarded<unsigned_int> *this,Mutex *param_2)

{
  uint *extraout_RDX;
  Locked<const_unsigned_int> LVar1;
  Maybe<kj::Quantity<long,_kj::_::NanosecondLabel>_> local_30;
  Mutex *local_20;
  MutexGuarded<unsigned_int> *this_local;
  MutexGuarded<unsigned_int> *local_10;
  
  local_20 = param_2;
  local_10 = this;
  Maybe<kj::Quantity<long,_kj::_::NanosecondLabel>_>::Maybe();
  kj::_::Mutex::lock(param_2,1,&local_30);
  Maybe<kj::Quantity<long,_kj::_::NanosecondLabel>_>::~Maybe(&local_30);
  Locked<const_unsigned_int>::Locked((Locked<const_unsigned_int> *)this,param_2,&param_2[1].futex);
  LVar1.ptr = extraout_RDX;
  LVar1.mutex = &this->mutex;
  return LVar1;
}

Assistant:

inline Locked<const T> MutexGuarded<T>::lockShared(LockSourceLocationArg location) const {
  mutex.lock(_::Mutex::SHARED, kj::none, location);
  return Locked<const T>(mutex, value);
}